

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O3

void __thiscall
tst_deprecations_helpers_qpromiseall::allPromisesSucceed(tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  long lVar2;
  long *plVar3;
  PromiseResolver<int> PVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar5;
  char cVar6;
  bool bVar7;
  QPromise<int> *data;
  PromiseData<int> *this_00;
  QObject *pQVar8;
  int *piVar9;
  QEvent *this_01;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  const_iterator expectedBegin;
  QSharedData *pQVar13;
  ulong uVar14;
  long lVar15;
  PromiseResolver<int> resolver;
  long local_c8 [2];
  QList<int> local_b8;
  PromiseData<int> *local_a0;
  undefined **local_98;
  PromiseData<int> *local_90;
  QPromise<QList<int>_> p;
  Type p1;
  Type p0;
  QArrayData *d_1;
  int *local_40;
  QObject *local_38;
  
  local_b8.d.d._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&p0,(int *)&local_b8);
  local_b8.d.d = (Data *)CONCAT44(local_b8.d.d._4_4_,0x2c);
  QtPromise::resolve<int>((QtPromise *)&p1,(int *)&local_b8);
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012dc58;
  QReadWriteLock::QReadWriteLock
            (&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0012dbf0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar13 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar13 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar13 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0012dbb8;
  local_b8.d.ptr = (int *)this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_b8);
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0012d950;
  if ((PromiseData<int> *)local_b8.d.ptr != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_b8.d.ptr)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_b8.d.ptr != (PromiseData<int> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_b8.d.ptr)->_vptr_PromiseDataBase[1])();
    }
  }
  PVar4.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  pQVar8 = (QObject *)QThread::currentThread();
  if ((pQVar8 != (QObject *)0x0) &&
     (piVar9 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar8), local_40 = piVar9,
     local_38 = pQVar8, piVar9 != (int *)0x0)) {
    if ((piVar9[1] != 0) && (cVar6 = QThread::isFinished(), cVar6 == '\0')) {
      if (piVar9[1] == 0) {
        pQVar8 = (QObject *)(QThread *)0x0;
      }
      pQVar8 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar8);
      if ((pQVar8 != (QObject *)0x0) || (cVar6 = QCoreApplication::closingDown(), cVar6 == '\0')) {
        this_01 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(this_01,None);
        *(undefined ***)this_01 = &PTR__Event_0012d6e0;
        *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
         (this_01 + 0x10) = PVar4.m_d.d;
        if (PVar4.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar8,this_01,0);
        piVar9 = local_40;
        if (local_40 == (int *)0x0) goto LAB_0010535b;
      }
    }
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      piVar9 = local_40;
      if (local_40 == (int *)0x0) {
        piVar9 = (int *)0x0;
      }
      operator_delete(piVar9);
    }
  }
LAB_0010535b:
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  local_b8.d.ptr = (int *)p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0012dbb8;
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_b8.d.size = (qsizetype)&PTR__QPromiseBase_0012dbb8;
  local_90 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98 = &PTR__QPromiseBase_0012dbb8;
  local_a0 = this_00;
  lVar10 = QArrayData::allocate((QArrayData **)&resolver,0x10,8,3,KeepSize);
  local_c8[0] = 0;
  uVar14 = 0xfffffffffffffff0;
  do {
    lVar15 = local_c8[0] * 0x10;
    *(undefined ***)(lVar10 + lVar15) = &PTR__QPromiseBase_0012d950;
    lVar2 = *(long *)((long)&local_a0 + uVar14);
    *(long *)(lVar10 + 8 + lVar15) = lVar2;
    if (lVar2 != 0) {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    *(undefined ***)(lVar15 + lVar10) = &PTR__QPromiseBase_0012dbb8;
    local_c8[0] = local_c8[0] + 1;
    uVar14 = uVar14 + 0x10;
  } while (uVar14 < 0x20);
  QtPromise::all<int,_QList>((QtPromise *)&p,(QList<QtPromise::QPromise<int>_> *)&resolver);
  QArrayDataPointer<QtPromise::QPromise<int>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<int>_> *)&resolver);
  lVar10 = 0x30;
  do {
    *(undefined ***)((long)local_c8 + lVar10) = &PTR__QPromiseBase_0012d950;
    lVar2 = *(long *)((long)local_c8 + lVar10 + 8);
    if (lVar2 != 0) {
      LOCK();
      piVar9 = (int *)(lVar2 + 8);
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if ((*piVar9 == 0) &&
         (plVar3 = *(long **)((long)local_c8 + lVar10 + 8), plVar3 != (long *)0x0)) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    QVar5.d = p0.super_QPromiseBase<int>.m_d.d;
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  bVar7 = (bool)(~bVar7 & ((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data
                          ._M_exception_object == (void *)0x0);
  local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar7);
  resolver.m_d.d._0_1_ = 1;
  pcVar11 = QTest::toString<bool>((bool *)&local_b8);
  pcVar12 = QTest::toString<bool>((bool *)&resolver);
  cVar6 = QTest::compare_helper
                    (bVar7,"Compared values are not the same",pcVar11,pcVar12,"p0.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x6d);
  QVar5 = p1.super_QPromiseBase<int>.m_d;
  if (cVar6 != '\0') {
    bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar7 = (bool)(~bVar7 & ((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object == (void *)0x0);
    local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar7);
    resolver.m_d.d._0_1_ = 1;
    pcVar11 = QTest::toString<bool>((bool *)&local_b8);
    pcVar12 = QTest::toString<bool>((bool *)&resolver);
    cVar6 = QTest::compare_helper
                      (bVar7,"Compared values are not the same",pcVar11,pcVar12,"p1.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x6e);
    if (cVar6 != '\0') {
      bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
      local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar7);
      resolver.m_d.d._0_1_ = 1;
      pcVar11 = QTest::toString<bool>((bool *)&local_b8);
      pcVar12 = QTest::toString<bool>((bool *)&resolver);
      cVar6 = QTest::compare_helper
                        (bVar7,"Compared values are not the same",pcVar11,pcVar12,"p2.isPending()",
                         "true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0x6f);
      if (cVar6 != '\0') {
        bVar7 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                          (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                            super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
        local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar7);
        resolver.m_d.d._0_1_ = 1;
        pcVar11 = QTest::toString<bool>((bool *)&local_b8);
        pcVar12 = QTest::toString<bool>((bool *)&resolver);
        cVar6 = QTest::compare_helper
                          (bVar7,"Compared values are not the same",pcVar11,pcVar12,"p.isPending()",
                           "true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0x70);
        if (cVar6 != '\0') {
          resolver.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
               (Data *)0x0;
          local_c8[0] = 0;
          waitForValue<QList<int>>(&local_b8,&p,(QList<int> *)&resolver);
          expectedBegin.i = (int *)QArrayData::allocate(&d_1,4,8,3,KeepSize);
          expectedBegin.i[0] = 0x2a;
          expectedBegin.i[1] = 0x2b;
          expectedBegin.i[2] = 0x2c;
          bVar7 = QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
                            ((const_iterator)local_b8.d.ptr,
                             (const_iterator)(local_b8.d.ptr + local_b8.d.size),expectedBegin,
                             (const_iterator)(expectedBegin.i + 3),"waitForValue(p, QVector<int>{})"
                             ,"(QVector<int>{42, 43, 44})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                             ,0x71);
          if (d_1 != (QArrayData *)0x0) {
            LOCK();
            (d_1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (d_1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((d_1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(d_1,4,8);
            }
          }
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,4,8);
            }
          }
          if (resolver.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
            UNLOCK();
            if (*(int *)resolver.m_d.d == 0) {
              QArrayData::deallocate((QArrayData *)resolver.m_d.d,4,8);
            }
          }
          if (bVar7) {
            bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                              ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
            bVar7 = (bool)(~bVar7 & (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).
                                    m_error.m_data._M_exception_object == (void *)0x0);
            local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar7);
            resolver.m_d.d._0_1_ = 1;
            pcVar11 = QTest::toString<bool>((bool *)&local_b8);
            pcVar12 = QTest::toString<bool>((bool *)&resolver);
            QTest::compare_helper
                      (bVar7,"Compared values are not the same",pcVar11,pcVar12,"p2.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x72);
          }
        }
      }
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d8f0;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  LOCK();
  (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d950;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d950;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::allPromisesSucceed()
{
    auto p0 = QtPromise::resolve(42);
    auto p1 = QtPromise::resolve(44);
    auto p2 = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve(43);
        });
    }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(p2.isFulfilled(), true);
}